

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosStream.cpp
# Opt level: O0

StepStatus __thiscall
adiosStream::readADIOS
          (adiosStream *this,CommandRead *cmdR,Config *cfg,Settings *settings,size_t step)

{
  bool bVar1;
  ostream *poVar2;
  element_type *peVar3;
  double *pdVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *__s;
  long in_RCX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_R8;
  string content;
  int i;
  vector<double,_std::allocator<double>_> readtime_all_ranks;
  int totalRanks;
  int myRank;
  shared_ptr<VariableInfo> ov;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_> *__range1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *v_1;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  varmap;
  StepStatus status;
  double readTime;
  double timeEnd;
  double timeStart;
  shared_ptr<VariableInfo> *v;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_> *__range3;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  shared_ptr<VariableInfo> *in_stack_fffffffffffffd90;
  char *__rhs;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffda0;
  ostream *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  string local_230 [12];
  int in_stack_fffffffffffffddc;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [36];
  int local_12c;
  shared_ptr<VariableInfo> *in_stack_fffffffffffffed8;
  adiosStream *in_stack_fffffffffffffee0;
  int local_110;
  int local_10c [5];
  vector<double,_std::allocator<double>_> local_f8;
  __normal_iterator<std::shared_ptr<VariableInfo>_*,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>
  local_e0;
  long local_d8;
  reference local_d0;
  _Self local_c8;
  _Self local_c0;
  undefined1 *local_b8;
  undefined1 local_a0 [52];
  StepStatus local_6c;
  double local_68;
  double local_60;
  double local_58;
  reference local_50;
  shared_ptr<VariableInfo> *local_48;
  __normal_iterator<std::shared_ptr<VariableInfo>_*,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>
  local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_18;
  StepStatus local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  if ((*(long *)(in_RCX + 0xa0) == 0) && (*(int *)(in_RCX + 0x60) != 0)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"    Read ");
    poVar2 = std::operator<<(poVar2,(string *)(local_18 + 0x38));
    poVar2 = std::operator<<(poVar2," with timeout value ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(local_18 + 0x78));
    poVar2 = std::operator<<(poVar2," using the group ");
    std::operator<<(poVar2,(string *)(local_18 + 0x58));
    bVar1 = std::
            vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>::
            empty((vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
                   *)in_stack_fffffffffffffda0);
    if (!bVar1) {
      std::operator<<((ostream *)&std::cout," with selected variables:  ");
      local_38 = local_18 + 0x80;
      local_40._M_current =
           (shared_ptr<VariableInfo> *)
           std::
           vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>::
           begin((vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      local_48 = (shared_ptr<VariableInfo> *)
                 std::
                 vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
                 ::end((vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
                        *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::shared_ptr<VariableInfo>_*,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>
                                 *)in_stack_fffffffffffffd90,
                                (__normal_iterator<std::shared_ptr<VariableInfo>_*,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)),
            bVar1) {
        local_50 = __gnu_cxx::
                   __normal_iterator<std::shared_ptr<VariableInfo>_*,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>
                   ::operator*(&local_40);
        peVar3 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1352ae);
        poVar2 = std::operator<<((ostream *)&std::cout,(string *)peVar3);
        std::operator<<(poVar2," ");
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<VariableInfo>_*,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>
        ::operator++(&local_40);
      }
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"... ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  MPI_Barrier(in_RDI[2].field_2._M_allocated_capacity);
  local_58 = (double)MPI_Wtime();
  local_6c = adios2::Engine::BeginStep((int)in_RDI + 0x30,*(float *)(local_18 + 0x78));
  local_4 = local_6c;
  if (local_6c == OK) {
    if (((*(long *)(local_28 + 0xa0) == 0) && (*(int *)(local_28 + 0x60) != 0)) && (local_30 == 1))
    {
      adios2::IO::AvailableVariables_abi_cxx11_(SUB81(local_a0,0));
      in_stack_fffffffffffffdc0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<((ostream *)&std::cout,"    Variables in input for reading: ");
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffffdc0,std::endl<char,std::char_traits<char>>);
      local_b8 = local_a0;
      local_c0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      local_c8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      while (bVar1 = std::operator!=(&local_c0,&local_c8), bVar1) {
        local_d0 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                *)in_stack_fffffffffffffd90);
        in_stack_fffffffffffffdb8 = std::operator<<((ostream *)&std::cout,"        ");
        poVar2 = std::operator<<(in_stack_fffffffffffffdb8,(string *)local_d0);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)in_stack_fffffffffffffd90);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              *)0x1354db);
    }
    if ((*(long *)(local_28 + 0xa0) == 0) && (*(int *)(local_28 + 0x60) != 0)) {
      poVar2 = std::operator<<((ostream *)&std::cout,"    Read data ");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    local_d8 = local_18 + 0x80;
    local_e0._M_current =
         (shared_ptr<VariableInfo> *)
         std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
         ::begin((vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
                  ::end((vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
                         *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<VariableInfo>_*,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>
                               *)in_stack_fffffffffffffd90,
                              (__normal_iterator<std::shared_ptr<VariableInfo>_*,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<VariableInfo>_*,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>
      ::operator*(&local_e0);
      in_stack_fffffffffffffda0 = &local_f8;
      std::shared_ptr<VariableInfo>::shared_ptr
                (in_stack_fffffffffffffd90,
                 (shared_ptr<VariableInfo> *)
                 CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      std::shared_ptr<VariableInfo>::shared_ptr
                (in_stack_fffffffffffffd90,
                 (shared_ptr<VariableInfo> *)
                 CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      getADIOSArray(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      std::shared_ptr<VariableInfo>::~shared_ptr((shared_ptr<VariableInfo> *)0x1355d2);
      std::shared_ptr<VariableInfo>::~shared_ptr((shared_ptr<VariableInfo> *)0x1355df);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<VariableInfo>_*,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>
      ::operator++(&local_e0);
    }
    if ((local_30 == 1) && ((*(byte *)(local_28 + 0x72) & 1) != 0)) {
      if ((*(long *)(local_28 + 0xa0) == 0) && (*(int *)(local_28 + 0x60) != 0)) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "        Lock Reader Selections for Fixed Pattern before first EndStep"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      adios2::Engine::LockWriterDefinitions();
    }
    adios2::Engine::EndStep();
    local_60 = (double)MPI_Wtime();
    MPI_Comm_rank(in_RDI[2].field_2._M_allocated_capacity,local_10c);
    MPI_Comm_size(in_RDI[2].field_2._M_allocated_capacity,&local_110);
    if (((byte)in_RDI[2]._M_dataplus & 1) != 0) {
      local_68 = local_60 - local_58;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x13570c);
      if (local_10c[0] == 0) {
        std::vector<double,_std::allocator<double>_>::reserve
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0,
                   (size_type)in_stack_fffffffffffffdb8);
      }
      pdVar4 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x135755);
      __rhs = (char *)in_RDI[2].field_2._M_allocated_capacity;
      MPI_Gather(&local_68,1,&ompi_mpi_double,pdVar4,1,&ompi_mpi_double,0);
      if (local_10c[0] == 0) {
        for (local_12c = 0; local_12c < local_110; local_12c = local_12c + 1) {
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  adios2::Engine::CurrentStep();
          std::__cxx11::to_string((unsigned_long)in_RDI);
          std::operator+(__lhs,__rhs);
          std::__cxx11::to_string(in_stack_fffffffffffffddc);
          std::operator+(in_RDI,in_stack_fffffffffffffdc0);
          std::operator+(__lhs,__rhs);
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)&stack0xfffffffffffffed8,
                     (long)local_12c);
          std::__cxx11::to_string((double)__lhs);
          std::operator+(in_RDI,in_stack_fffffffffffffdc0);
          std::operator+(__lhs,__rhs);
          std::__cxx11::string::~string(local_170);
          std::__cxx11::string::~string(local_230);
          std::__cxx11::string::~string(local_190);
          std::__cxx11::string::~string(local_1b0);
          std::__cxx11::string::~string(local_210);
          std::__cxx11::string::~string(local_1d0);
          std::__cxx11::string::~string(local_1f0);
          __s = (char *)std::__cxx11::string::c_str();
          fputs(__s,*(FILE **)((long)&in_RDI[2].field_2 + 8));
          std::__cxx11::string::~string(local_150);
        }
      }
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffda0);
    }
    local_4 = local_6c;
  }
  return local_4;
}

Assistant:

adios2::StepStatus adiosStream::readADIOS(CommandRead *cmdR, Config &cfg, const Settings &settings,
                                          size_t step)
{
    if (!settings.myRank && settings.verbose)
    {
        std::cout << "    Read " << cmdR->streamName << " with timeout value " << cmdR->timeout_sec
                  << " using the group " << cmdR->groupName;
        if (!cmdR->variables.empty())
        {
            std::cout << " with selected variables:  ";
            for (const auto &v : cmdR->variables)
            {
                std::cout << v->name << " ";
            }
        }
        std::cout << "... " << std::endl;
    }
    double timeStart, timeEnd;
    double readTime;
    // double maxReadTime, minReadTime;
    MPI_Barrier(comm);
    timeStart = MPI_Wtime();
    adios2::StepStatus status = engine.BeginStep(cmdR->stepMode, cmdR->timeout_sec);
    if (status != adios2::StepStatus::OK)
    {
        return status;
    }

    if (!settings.myRank && settings.verbose && step == 1)
    {
        const auto varmap = io.AvailableVariables();
        std::cout << "    Variables in input for reading: " << std::endl;
        for (const auto &v : varmap)
        {
            std::cout << "        " << v.first << std::endl;
        }
    }

    if (!settings.myRank && settings.verbose)
    {
        std::cout << "    Read data " << std::endl;
    }

    for (auto ov : cmdR->variables)
    {
        getADIOSArray(ov);
    }

    if (step == 1 && settings.fixedPattern)
    {
        if (!settings.myRank && settings.verbose)
        {
            std::cout << "        Lock Reader Selections for Fixed Pattern before "
                         "first EndStep"
                      << std::endl;
        }
        engine.LockWriterDefinitions();
    }

    engine.EndStep();
    timeEnd = MPI_Wtime();
    int myRank, totalRanks;
    MPI_Comm_rank(comm, &myRank);
    MPI_Comm_size(comm, &totalRanks);
    if (hasIOTimer)
    {
        readTime = timeEnd - timeStart;
        // double *writetime_all_ranks = NULL;
        std::vector<double> readtime_all_ranks;
        if (myRank == 0)
        {
            // writetime_all_ranks = (double *)malloc(totalRanks);
            //	if (!writetime_all_ranks)
            //	{
            //	    std::cout << "rank " << myRank << ": malloc failed!" <<
            // std::endl;
            //	}
            //	else
            //	{
            //	    std::cout << "rank " << myRank << ": malloc succeeded!" <<
            // std::endl;
            //	}
            readtime_all_ranks.reserve(totalRanks);
        }

        MPI_Gather(&readTime, 1, MPI_DOUBLE, readtime_all_ranks.data(), 1, MPI_DOUBLE, 0, comm);
        if (myRank == 0)
        {
            for (int i = 0; i < totalRanks; i++)
            {
                std::string content = std::to_string(engine.CurrentStep()) + "," +
                                      std::to_string(i) + ",read," +
                                      std::to_string(readtime_all_ranks[i]) + "\n";
                // std::cout << content;
                fputs(content.c_str(), perfLogFP);
            }
        }
    }

    // for (auto ov : cmdR->variables)
    // {
    //     if (settings.myRank == 1)
    //     {
    //         size_t varsize = std::accumulate(ov->count.begin(),
    //         ov->count.end(), 1,
    //                             std::multiplies<std::size_t>());
    //         std::cout << ov->name << ", " << varsize << std::endl;
    //         const double *dd = reinterpret_cast<double *>(ov->data.data());
    //         for (int j = 0; j < varsize; j++)
    //             std::cout << dd[j] << ", ";
    //         std::cout << std::endl;
    //     }
    // }
    return status;
}